

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_bss_section.hpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::
bss_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
::key(bss_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
      *this,string *k)

{
  bool bVar1;
  uint64_t *args;
  error_code eVar2;
  
  bVar1 = std::operator==(k,"align");
  if (bVar1) {
    *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
         (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 1;
    args = &this->align_;
  }
  else {
    bVar1 = std::operator==(k,"size");
    if (!bVar1) {
      eVar2 = make_error_code(unrecognized_section_object_key);
      return eVar2;
    }
    *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
         (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 2;
    args = &this->size_;
  }
  eVar2 = rule::push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
                    (&this->super_rule,args);
  return eVar2;
}

Assistant:

std::error_code bss_section<OutputIterator>::key (std::string const & k) {
                if (k == "align") {
                    seen_[align] = true; // integer
                    return this->push<uint64_rule> (&align_);
                }
                if (k == "size") {
                    seen_[size] = true;
                    return this->push<uint64_rule> (&size_);
                }
                return error::unrecognized_section_object_key;
            }